

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.h
# Opt level: O3

void __thiscall
Connection::readUntil<ByteLimit>(Connection *this,ByteLimit *condition,ReadCallback *callback)

{
  size_t sVar1;
  vtable_base *pvVar2;
  function_buffer *pfVar3;
  function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>
  local_a0;
  shared_ptr<Connection> local_80;
  basic_streambuf_ref<std::allocator<char>_> local_70;
  socket *local_68;
  ByteLimit local_60;
  bind_t<void,_boost::_mfi::mf3<void,_Connection,_const_boost::system::error_code_&,_unsigned_long,_boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_&>,_boost::_bi::list4<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_>_>_>
  local_58;
  
  sVar1 = condition->m_limit;
  boost::enable_shared_from_this<Connection>::shared_from_this
            ((enable_shared_from_this<Connection> *)&local_80);
  local_a0.
  super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
  .super_function_base.vtable = (vtable_base *)0x0;
  pvVar2 = (callback->
           super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
           ).super_function_base.vtable;
  if (pvVar2 != (vtable_base *)0x0) {
    pfVar3 = &(callback->
              super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
              ).super_function_base.functor;
    local_a0.
    super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
    .super_function_base.vtable = pvVar2;
    if (((ulong)pvVar2 & 1) == 0) {
      (*pvVar2->manager)(pfVar3,&local_a0.
                                 super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
                                 .super_function_base.functor,clone_functor_tag);
    }
    else {
      local_a0.
      super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
      .super_function_base.functor._16_8_ =
           *(undefined8 *)
            ((long)&(callback->
                    super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
                    ).super_function_base.functor + 0x10);
      local_a0.
      super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
      .super_function_base.functor.members._0_8_ = (undefined8)*(undefined8 *)pfVar3;
      local_a0.
      super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
      .super_function_base.functor._8_8_ =
           *(undefined8 *)
            ((long)&(callback->
                    super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
                    ).super_function_base.functor + 8);
    }
  }
  boost::
  bind<void,Connection,boost::system::error_code_const&,unsigned_long,boost::function<void(boost::system::error_code_const&,std::istream&)>&,boost::shared_ptr<Connection>,boost::arg<1>(*)(),boost::arg<2>(*)(),boost::function<void(boost::system::error_code_const&,std::istream&)>>
            (&local_58,(boost *)_readHandler,0,&local_80,boost::asio::placeholders::error,
             boost::asio::placeholders::bytes_transferred,&local_a0);
  local_68 = &this->m_socket;
  local_70.sb_ = &this->m_readBuffer;
  local_60.m_limit = sVar1;
  boost::asio::detail::
  initiate_async_read_until_match_v1<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
  ::operator()((initiate_async_read_until_match_v1<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                *)&local_68,&local_58,&local_70,&local_60);
  boost::
  function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
  ::~function2((function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
                *)&local_58.l_.
                   super_storage4<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_>_>
                   .a4_);
  boost::detail::shared_count::~shared_count
            ((shared_count *)
             ((long)&local_58.l_.
                     super_storage4<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)(),_boost::_bi::value<boost::function<void_(const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&)>_>_>
                     .
                     super_storage3<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)(),_boost::arg<2>_(*)()>
                     .
                     super_storage2<boost::_bi::value<boost::shared_ptr<Connection>_>,_boost::arg<1>_(*)()>
                     .super_storage1<boost::_bi::value<boost::shared_ptr<Connection>_>_> + 8));
  boost::
  function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
  ::~function2(&local_a0.
                super_function2<void,_const_boost::system::error_code_&,_std::basic_istream<char,_std::char_traits<char>_>_&>
              );
  boost::detail::shared_count::~shared_count(&local_80.pn);
  return;
}

Assistant:

void readUntil( Condition condition, ReadCallback callback ){
        boost::asio::async_read_until(
            m_socket,
            m_readBuffer,
            condition,
            boost::bind(
                &Connection::_readHandler,
                shared_from_this(),
                boost::asio::placeholders::error,
                boost::asio::placeholders::bytes_transferred,
                callback
            )
        );
    }